

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::SparseMatrix<double,0,int>,Eigen::SparseSelfAdjointView<Eigen::SparseMatrix<double,0,int>const,1u>,Eigen::internal::assign_op<double,double>>
               (SparseMatrix<double,_0,_int> *dst,
               SparseSelfAdjointView<const_Eigen::SparseMatrix<double,_0,_int>,_1U> *src,
               assign_op<double,_double> *func)

{
  SparseMatrix<double,_0,_int> *in_RDI;
  ActualDstType actualDst;
  SparseSelfAdjointView<const_Eigen::SparseMatrix<double,_0,_int>,_1U> *in_stack_ffffffffffffffd8;
  
  Assignment<Eigen::SparseMatrix<double,0,int>,Eigen::SparseSelfAdjointView<Eigen::SparseMatrix<double,0,int>const,1u>,Eigen::internal::assign_op<double,double>,Eigen::internal::SparseSelfAdjoint2Sparse,void>
  ::run<double,0>(in_RDI,in_stack_ffffffffffffffd8,(AssignOpType *)0x1e1821);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);
  
  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);
  
  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}